

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double eval_guided_crit<float,long_double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,double *buffer_sd,
                 bool as_relative_gain,double *buffer_imputed_x,double *saved_xmedian,
                 size_t *split_ix,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr)

{
  float *pfVar1;
  byte bVar2;
  double *Xr_00;
  double *in_RCX;
  double *in_RDX;
  double *unaff_RBX;
  double *in_RSI;
  size_t *in_RDI;
  byte in_R9B;
  double *unaff_R12;
  size_t *unaff_R13;
  double *unaff_R14;
  double in_XMM0_Qa;
  double *in_stack_00000010;
  ulong *in_stack_00000018;
  double *in_stack_00000020;
  double *in_stack_00000028;
  double *in_stack_00000030;
  int in_stack_00000038;
  int in_stack_00000040;
  byte in_stack_00000058;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  vector<double,_std::allocator<double>_> temp_buffer_1;
  vector<double,_std::allocator<double>_> temp_buffer;
  size_t ix;
  float xmean;
  double gain;
  size_t st_orig;
  double *in_stack_fffffffffffffdb8;
  double *in_stack_fffffffffffffdc0;
  size_t in_stack_fffffffffffffdc8;
  allocator_type *in_stack_fffffffffffffdd0;
  double *in_stack_fffffffffffffdd8;
  anon_class_8_1_54a39818 in_stack_fffffffffffffde0;
  double *in_stack_fffffffffffffde8;
  size_t *in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffdf8;
  double *in_stack_fffffffffffffe10;
  size_t *in_stack_fffffffffffffe18;
  double *in_stack_fffffffffffffe28;
  float *in_stack_fffffffffffffe30;
  size_t in_stack_fffffffffffffe38;
  size_t in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  size_t *in_stack_fffffffffffffe50;
  double *in_stack_fffffffffffffe60;
  float local_10c;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  double *in_stack_ffffffffffffff60;
  double *pdVar3;
  undefined4 in_stack_ffffffffffffff68;
  float fVar4;
  size_t *ix_arr_00;
  double dVar5;
  undefined7 in_stack_ffffffffffffff88;
  double local_70;
  size_t *in_stack_ffffffffffffffc8;
  
  bVar2 = in_stack_00000058 & 1;
  dVar5 = 0.0;
  if ((in_stack_00000038 == 4) || (local_70 = in_XMM0_Qa, in_stack_00000038 == 3)) {
    local_70 = 0.0;
  }
  Xr_00 = in_RSI;
  if (in_stack_00000040 != 0) {
    Xr_00 = (double *)
            move_NAs_to_front<float>
                      (in_stack_fffffffffffffdf0,(size_t)in_stack_fffffffffffffde8,
                       (size_t)in_stack_fffffffffffffde0.x,(float *)in_stack_fffffffffffffdd8);
  }
  if (Xr_00 < in_RDX) {
    if (Xr_00 == (double *)((long)in_RDX - 1U)) {
      fVar4 = *(float *)((long)in_RCX + in_RDI[(long)Xr_00] * 4);
      pfVar1 = (float *)((long)in_RCX + in_RDI[(long)in_RDX] * 4);
      if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) {
        dVar5 = midpoint_with_reorder<float>
                          ((float)((ulong)in_stack_fffffffffffffdb8 >> 0x20),
                           SUB84(in_stack_fffffffffffffdb8,0));
        *in_stack_00000020 = dVar5;
        *in_stack_00000018 = (ulong)Xr_00;
        if (1.0 <= local_70) {
          dVar5 = 0.0;
        }
        else {
          dVar5 = 1.0;
        }
      }
      else {
        dVar5 = -INFINITY;
      }
    }
    else {
      ix_arr_00 = (size_t *)&stack0xffffffffffffffa8;
      std::
      sort<unsigned_long*,eval_guided_crit<float,long_double>(unsigned_long*,unsigned_long,unsigned_long,float*,double*,bool,double*,double*,unsigned_long&,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*)::_lambda(unsigned_long,unsigned_long)_1_>
                ((unsigned_long *)in_stack_fffffffffffffdd8,
                 (unsigned_long *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffde0);
      fVar4 = *(float *)((long)in_RCX + in_RDI[(long)Xr_00] * 4);
      pfVar1 = (float *)((long)in_RCX + in_RDI[(long)in_RDX] * 4);
      if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) {
        *in_stack_00000028 = (double)*(float *)((long)in_RCX + in_RDI[(long)Xr_00] * 4);
        *in_stack_00000030 = (double)*(float *)((long)in_RCX + in_RDI[(long)in_RDX] * 4);
        fVar4 = 0.0;
        pdVar3 = Xr_00;
        if ((in_stack_00000038 == 2) || (in_stack_00000038 == 1)) {
          for (; pdVar3 <= in_RDX; pdVar3 = (double *)((long)pdVar3 + 1)) {
            fVar4 = *(float *)((long)in_RCX + in_RDI[(long)pdVar3] * 4) + fVar4;
          }
          local_10c = (float)(ulong)((long)in_RDX + (1 - (long)Xr_00));
          fVar4 = fVar4 / local_10c;
          in_stack_ffffffffffffff60 = pdVar3;
        }
        if ((in_stack_00000040 == 0x16) && (in_RSI < Xr_00)) {
          fill_NAs_with_median<float>
                    (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                     in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                     in_stack_fffffffffffffe60);
          if (((in_stack_00000038 != 2) || ((in_R9B & 1) == 0)) || (0.0 < local_70)) {
            if ((in_stack_00000038 == 2) || (in_stack_00000038 == 1)) {
              dVar5 = find_split_std_gain<double,long_double>
                                (in_stack_fffffffffffffdf8,(double)in_stack_fffffffffffffdf0,
                                 (size_t *)in_stack_fffffffffffffde8,
                                 (size_t)in_stack_fffffffffffffde0.x,
                                 (size_t)in_stack_fffffffffffffdd8,
                                 (double *)in_stack_fffffffffffffdd0,
                                 (GainCriterion)(in_stack_fffffffffffffdc8 >> 0x20),
                                 (double)in_stack_00000018,in_stack_fffffffffffffe10,
                                 in_stack_fffffffffffffe18);
            }
            else if (in_stack_00000038 == 4) {
              dVar5 = find_split_dens<double,long_double>
                                (in_stack_fffffffffffffdd8,(size_t *)in_stack_fffffffffffffdd0,
                                 in_stack_fffffffffffffdc8,(size_t)in_stack_fffffffffffffdc0,
                                 in_stack_00000010,(size_t *)0x4be5e6);
            }
            else if (in_stack_00000038 == 3) {
              std::allocator<double>::allocator((allocator<double> *)0x4be62a);
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0.x,
                         (size_type)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
              std::allocator<double>::~allocator((allocator<double> *)0x4be656);
              std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x4be70a);
              std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)0x4be71a);
              dVar5 = find_split_full_gain<double,long_double>
                                ((double *)CONCAT17(bVar2,in_stack_ffffffffffffff88),(size_t)in_RSI,
                                 (size_t)dVar5,ix_arr_00,
                                 (size_t *)CONCAT44(fVar4,in_stack_ffffffffffffff68),
                                 (size_t)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f,
                                 in_RCX,(size_t)in_RDX,Xr_00,in_RDI,in_stack_ffffffffffffffc8,
                                 unaff_RBX,unaff_R12,unaff_R13,unaff_R14,
                                 (bool)in_stack_ffffffffffffff5e);
              std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000070);
            }
          }
          else {
            dVar5 = find_split_rel_gain<double,long_double>
                              (in_stack_fffffffffffffde8,(double)in_stack_fffffffffffffde0.x,
                               (size_t *)in_stack_fffffffffffffdd8,(size_t)in_stack_fffffffffffffdd0
                               ,in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                               (size_t *)in_stack_00000010);
          }
        }
        else if ((in_stack_00000038 != 2) || (((in_R9B & 1) == 0 || (0.0 < local_70)))) {
          if ((in_stack_00000038 == 2) || (in_stack_00000038 == 1)) {
            dVar5 = find_split_std_gain<float,long_double>
                              ((float *)in_stack_fffffffffffffdf8,
                               (float)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                               (size_t *)in_stack_fffffffffffffde8,
                               (size_t)in_stack_fffffffffffffde0.x,(size_t)in_stack_fffffffffffffdd8
                               ,(double *)in_stack_fffffffffffffdd0,
                               (GainCriterion)(in_stack_fffffffffffffdc8 >> 0x20),
                               (double)in_stack_00000018,in_stack_fffffffffffffe10,
                               in_stack_fffffffffffffe18);
          }
          else if (in_stack_00000038 == 4) {
            dVar5 = find_split_dens<float,long_double>
                              ((float *)in_stack_fffffffffffffdd8,
                               (size_t *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                               (size_t)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                               (size_t *)0x4be97a);
          }
          else if (in_stack_00000038 == 3) {
            std::allocator<double>::allocator((allocator<double> *)0x4be9be);
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffde0.x,
                       (size_type)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
            std::allocator<double>::~allocator((allocator<double> *)0x4be9ea);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x4bea8f);
            std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x4bea9c);
            dVar5 = find_split_full_gain<float,long_double>
                              ((float *)CONCAT17(bVar2,in_stack_ffffffffffffff88),(size_t)in_RSI,
                               (size_t)dVar5,ix_arr_00,
                               (size_t *)CONCAT44(fVar4,in_stack_ffffffffffffff68),
                               (size_t)in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f,
                               in_RCX,(size_t)in_RDX,Xr_00,in_RDI,in_stack_ffffffffffffffc8,
                               unaff_RBX,unaff_R12,unaff_R13,unaff_R14,
                               (bool)in_stack_ffffffffffffff5e);
            std::vector<double,_std::allocator<double>_>::~vector(in_stack_00000070);
          }
        }
        else {
          dVar5 = find_split_rel_gain<float,long_double>
                            ((float *)in_stack_fffffffffffffde8,
                             (float)((ulong)in_stack_fffffffffffffde0.x >> 0x20),
                             (size_t *)in_stack_fffffffffffffdd8,(size_t)in_stack_fffffffffffffdd0,
                             in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                             (size_t *)in_stack_fffffffffffffdb8);
        }
        if (dVar5 <= 0.0) {
          dVar5 = 0.0;
        }
      }
      else {
        dVar5 = -INFINITY;
      }
    }
  }
  else {
    dVar5 = -INFINITY;
  }
  return dVar5;
}

Assistant:

double eval_guided_crit(size_t *restrict ix_arr, size_t st, size_t end, real_t_ *restrict x,
                        double *restrict buffer_sd, bool as_relative_gain,
                        double *restrict buffer_imputed_x, double *restrict saved_xmedian,
                        size_t &split_ix, double &restrict split_point, double &restrict xmin, double &restrict xmax,
                        GainCriterion criterion, double min_gain, MissingAction missing_action,
                        size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                        double *restrict X_row_major, size_t ncols,
                        double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr)
{
    size_t st_orig = st;
    double gain = 0;
    if (criterion == DensityCrit || criterion == FullGain) min_gain = 0;

    /* move NAs to the front if there's any, exclude them from calculations */
    if (missing_action != Fail)
        st = move_NAs_to_front(ix_arr, st, end, x);

    if (unlikely(st >= end)) return -HUGE_VAL;
    else if (unlikely(st == (end-1)))
    {
        if (x[ix_arr[st]] == x[ix_arr[end]])
            return -HUGE_VAL;
        split_point = midpoint_with_reorder(x[ix_arr[st]], x[ix_arr[end]]);
        split_ix    = st;
        gain        = 1.;
        if (gain > min_gain)
            return gain;
        else
            return 0.;
    }

    /* sort in ascending order */
    std::sort(ix_arr + st, ix_arr + end + 1, [&x](const size_t a, const size_t b){return x[a] < x[b];});
    if (x[ix_arr[st]] == x[ix_arr[end]]) return -HUGE_VAL;
    xmin = x[ix_arr[st]]; xmax = x[ix_arr[end]];

    /* unlike the previous case for the extended model, the data here has not been centered,
       which could make the standard deviations have poor precision. It's nevertheless not
       necessary for this mean to have good precision, since it's only meant for centering,
       so it can be calculated inexactly with simd instructions. */
    real_t_ xmean = 0;
    if (criterion == Pooled || criterion == Averaged)
    {
        for (size_t ix = st; ix <= end; ix++)
            xmean += x[ix_arr[ix]];
        xmean /= (real_t_)(end - st + 1);
    }

    if (missing_action == Impute && st > st_orig)
    {
        missing_action = Fail;
        fill_NAs_with_median(ix_arr, st_orig, st, end, x, buffer_imputed_x, saved_xmedian);
        if (criterion == Pooled && as_relative_gain && min_gain <= 0)
            gain = find_split_rel_gain<double, ldouble_safe>(buffer_imputed_x, (double)xmean, ix_arr, st_orig, end, split_point, split_ix);
        else if (criterion == Pooled || criterion == Averaged)
            gain = find_split_std_gain<double, ldouble_safe>(buffer_imputed_x, (double)xmean, ix_arr, st_orig, end, buffer_sd, criterion, min_gain, split_point, split_ix);
        else if (criterion == DensityCrit)
            gain = find_split_dens<double, ldouble_safe>(buffer_imputed_x, ix_arr, st_orig, end, split_point, split_ix);
        else if (criterion == FullGain)
        {
            /* TODO: this buffer should be allocated from outside */
            std::vector<double> temp_buffer(mult2(ncols));
            gain = find_split_full_gain<double, ldouble_safe>(
                                        buffer_imputed_x, st_orig, end, ix_arr,
                                        cols_use, ncols_use, force_cols_use,
                                        X_row_major, ncols,
                                        Xr, Xr_ind, Xr_indptr,
                                        temp_buffer.data(), temp_buffer.data() + ncols,
                                        split_ix, split_point, true);
        }

        /* Note: in theory, it should be possible to use a faster version assuming a contiguous array for 'x',
           but such an approach might give inexact split points. Better to avoid such inexactness at the
           expense of more computations. */
    }

    else
    {
        if (criterion == Pooled && as_relative_gain && min_gain <= 0)
            gain = find_split_rel_gain<real_t_, ldouble_safe>(x, xmean, ix_arr, st, end, split_point, split_ix);
        else if (criterion == Pooled || criterion == Averaged)
            gain = find_split_std_gain<real_t_, ldouble_safe>(x, xmean, ix_arr, st, end, buffer_sd, criterion, min_gain, split_point, split_ix);
        else if (criterion == DensityCrit)
            gain = find_split_dens<real_t_, ldouble_safe>(x, ix_arr, st, end, split_point, split_ix);
        else if (criterion == FullGain)
        {
            /* TODO: this buffer should be allocated from outside */
            std::vector<double> temp_buffer(mult2(ncols));
            gain = find_split_full_gain<real_t_, ldouble_safe>(
                                        x, st, end, ix_arr,
                                        cols_use, ncols_use, force_cols_use,
                                        X_row_major, ncols,
                                        Xr, Xr_ind, Xr_indptr,
                                        temp_buffer.data(), temp_buffer.data() + ncols,
                                        split_ix, split_point, true);
        }
    }

    /* Note: a gain of -Inf signals that the data is unsplittable. Zero signals it's below the minimum. */
    return std::fmax(0., gain);
}